

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
duckdb_fmt::v6::internal::vformat<char>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,basic_string_view<char> format_str,
          basic_format_args<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
          args)

{
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  undefined **local_230;
  undefined1 *local_228;
  long local_220;
  undefined8 local_218;
  undefined1 local_210 [504];
  
  local_220 = 0;
  local_230 = &PTR_grow_02436a80;
  local_218 = 500;
  local_228 = local_210;
  vformat_to<duckdb_fmt::v6::arg_formatter<duckdb_fmt::v6::buffer_range<char>>,char,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
            ((range)&local_230,format_str,args,(locale_ref)0x0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_228,local_228 + local_220);
  local_230 = &PTR_grow_02436a80;
  if (local_228 != local_210) {
    operator_delete(local_228);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::basic_string<Char> internal::vformat(
    basic_string_view<Char> format_str,
    basic_format_args<buffer_context<Char>> args) {
  basic_memory_buffer<Char> buffer;
  internal::vformat_to(buffer, format_str, args);
  return to_string(buffer);
}